

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix3 * matrix3_invert(matrix3 *self)

{
  matrix3 *pmVar1;
  byte local_35;
  undefined1 local_34 [7];
  uint8_t i;
  matrix3 inverse;
  matrix3 *self_local;
  
  inverse.field_0._28_8_ = self;
  pmVar1 = matrix3_inverse(self,(matrix3 *)local_34);
  if (pmVar1 != (matrix3 *)0x0) {
    for (local_35 = 0; local_35 < 9; local_35 = local_35 + 1) {
      *(undefined4 *)(inverse.field_0._28_8_ + (ulong)local_35 * 4) =
           *(undefined4 *)(local_34 + (ulong)local_35 * 4);
    }
  }
  return (matrix3 *)inverse.field_0._28_8_;
}

Assistant:

HYPAPI struct matrix3 *matrix3_invert(struct matrix3 *self)
{
	struct matrix3 inverse;
	uint8_t i;

	if (matrix3_inverse(self, &inverse)) {
		for (i = 0; i < 9; i++) {
			self->m[i] = inverse.m[i];
		}
	}

	return self;
}